

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_explain.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *progname_00;
  int iVar1;
  bool bVar2;
  char *progname;
  int flags;
  int ch;
  char **argv_local;
  int argc_local;
  
  progname._0_4_ = 0;
  progname_00 = *argv;
  while( true ) {
    iVar1 = getopt(argc,argv,"pahv");
    if (iVar1 == -1) {
      bVar2 = argc - _optind != 1;
      if (bVar2) {
        print_usage(progname_00);
      }
      else {
        version_explain(argv[_optind],(uint)progname);
      }
      argv_local._4_4_ = (uint)bVar2;
      return argv_local._4_4_;
    }
    if (iVar1 == 0x3f) break;
    if (iVar1 == 0x61) {
      progname._0_4_ = (uint)progname | 2;
    }
    else {
      if (iVar1 == 0x68) break;
      if (iVar1 != 0x70) {
        if (iVar1 != 0x76) {
          print_usage(progname_00);
          return 1;
        }
        print_version();
        return 0;
      }
      progname._0_4_ = (uint)progname | 1;
    }
  }
  print_usage(progname_00);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
	int ch, flags = 0;
	const char* progname = argv[0];

	while ((ch = getopt(argc, argv, "pahv")) != -1) {
		switch (ch) {
		case 'p':
			flags |= VERSIONFLAG_P_IS_PATCH;
			break;
		case 'a':
			flags |= VERSIONFLAG_ANY_IS_PATCH;
			break;
		case 'h':
		case '?':
			print_usage(progname);
			return 0;
		case 'v':
			print_version();
			return 0;
		default:
			print_usage(progname);
			return 1;
		}
	}

	argc -= optind;
	argv += optind;

	if (argc == 1) {
		version_explain(argv[0], flags);
		return 0;
	}

	print_usage(progname);
    return 1;
}